

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int32_t ne_core_main(int32_t argc,char **argv)

{
  int64_t iVar1;
  bool local_1a;
  ne_core_bool simulated_environment;
  char **argv_local;
  int32_t argc_local;
  
  local_1a = false;
  if (1 < argc) {
    iVar1 = test_string_compare(argv[1],"--simulated");
    local_1a = iVar1 == 0;
  }
  test_core(local_1a);
  test_io(local_1a);
  test_time(local_1a);
  test_filesystem(local_1a);
  return 0;
}

Assistant:

int32_t ne_core_main(int32_t argc, char *argv[])
{
  auto simulated_environment = static_cast<ne_core_bool>(
      argc >= 2 && test_string_compare(argv[1], "--simulated") == 0);

  // Invalid, but until we get a way for modules to run their own initialize
  // and register tests (dependency upon test) then  we must do this.
  extern void test_core(ne_core_bool simulated_environment);
  extern void test_io(ne_core_bool simulated_environment);
  extern void test_time(ne_core_bool simulated_environment);
  extern void test_filesystem(ne_core_bool simulated_environment);
  test_core(simulated_environment);
  test_io(simulated_environment);
  test_time(simulated_environment);
  test_filesystem(simulated_environment);

  // We can't know whether the test completed by this point do to callbacks.
  return 0;
}